

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsExecutionServer.cpp
# Opt level: O2

void __thiscall xs::ExecutionRequestHandler::pollKeepAlives(ExecutionRequestHandler *this)

{
  deUint64 dVar1;
  ProtocolError *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  Message local_28;
  
  dVar1 = deGetMicroseconds();
  if (dVar1 - this->m_lastKeepAliveReceived < 0x1c9c381) {
    if ((5000000 < dVar1 - this->m_lastKeepAliveSent) &&
       (7 < (this->m_bufferOut).m_size - (this->m_bufferOut).m_numElements)) {
      buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_28.type = MESSAGETYPE_KEEPALIVE;
      local_28._vptr_Message = (_func_int **)&PTR__Message_0012c578;
      Message::writeNoData(&local_28,&buf);
      de::RingBuffer<unsigned_char>::pushFront
                (&this->m_bufferOut,
                 buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                 (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      dVar1 = deGetMicroseconds();
      this->m_lastKeepAliveSent = dVar1;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    return;
  }
  this_00 = (ProtocolError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"Keepalive timeout occurred",(allocator<char> *)&local_28);
  ProtocolError::ProtocolError(this_00,(string *)&buf);
  __cxa_throw(this_00,&ProtocolError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExecutionRequestHandler::pollKeepAlives (void)
{
	deUint64 curTime = deGetMicroseconds();

	// Check that we've got keepalives in timely fashion.
	if (curTime - m_lastKeepAliveReceived > KEEPALIVE_TIMEOUT*1000)
		throw ProtocolError("Keepalive timeout occurred");

	// Send some?
	if (curTime - m_lastKeepAliveSent > KEEPALIVE_SEND_INTERVAL*1000 &&
		m_bufferOut.getNumFree() >= MESSAGE_HEADER_SIZE)
	{
		vector<deUint8> buf;
		KeepAliveMessage().write(buf);
		m_bufferOut.pushFront(&buf[0], (int)buf.size());

		m_lastKeepAliveSent = deGetMicroseconds();
	}
}